

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_learn_object_kinds(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object_kind *poVar3;
  object_kind *kind;
  char s [80];
  wchar_t i;
  wchar_t level;
  command_conflict *cmd_local;
  
  wVar2 = cmd_get_arg_number((command *)cmd,"level",(int *)(s + 0x4c));
  if (wVar2 != L'\0') {
    memset(&kind,0,0x50);
    kind._0_1_ = 0x31;
    kind._1_1_ = 0x30;
    kind._2_1_ = 0x30;
    _Var1 = get_string("Learn object kinds up to level (0-100)? ",(char *)&kind,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)&kind,(int *)(s + 0x4c));
    if (!_Var1) {
      return;
    }
    cmd_set_arg_number((command *)cmd,"level",s._76_4_);
  }
  s[0x48] = '\x01';
  s[0x49] = '\0';
  s[0x4a] = '\0';
  s[0x4b] = '\0';
  for (; (int)s._72_4_ < (int)(uint)z_info->k_max; s._72_4_ = s._72_4_ + 1) {
    poVar3 = k_info + (int)s._72_4_;
    if (((poVar3 != (object_kind *)0x0) && (poVar3->name != (char *)0x0)) &&
       (poVar3->level <= (int)s._76_4_)) {
      poVar3->aware = true;
    }
  }
  update_player_object_knowledge(player);
  msg("You now know about many items!");
  return;
}

Assistant:

void do_cmd_wiz_learn_object_kinds(struct command *cmd)
{
	int level, i;

	if (cmd_get_arg_number(cmd, "level", &level) != CMD_OK) {
		char s[80] = "100";

		if (!get_string("Learn object kinds up to level (0-100)? ",
			s, sizeof(s))) return;
		if (!get_int_from_string(s, &level)) return;
		cmd_set_arg_number(cmd, "level", level);
	}

	/* Scan all object kinds */
	for (i = 1; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Induce awareness */
		if (kind && kind->name && kind->level <= level) {
			kind->aware = true;
		}
	}

	update_player_object_knowledge(player);
	msg("You now know about many items!");
}